

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

void __thiscall CVmObjTable::reset_to_image(CVmObjTable *this)

{
  CVmObjGlobPage *this_00;
  vm_image_ptr_page *pvVar1;
  vm_image_ptr_page *pvVar2;
  vm_image_ptr_page *pvVar3;
  long lVar4;
  CVmObjPageEntry **ppCVar5;
  uint uVar6;
  size_t *psVar7;
  CVmObjPageEntry *pCVar8;
  size_t sVar9;
  
  CVmUndo::drop_undo(G_undo_X);
  this_00 = this->globals_;
  if (this_00 != (CVmObjGlobPage *)0x0) {
    CVmObjGlobPage::~CVmObjGlobPage(this_00);
    operator_delete(this_00,0x88);
    this->globals_ = (CVmObjGlobPage *)0x0;
  }
  sVar9 = this->pages_used_;
  if (sVar9 != 0) {
    ppCVar5 = this->pages_;
    uVar6 = 0;
    do {
      pCVar8 = *ppCVar5;
      lVar4 = 0;
      do {
        if ((*(ushort *)&pCVar8->field_0x14 & 0x83) == 2) {
          (**(code **)(*(long *)&pCVar8->ptr_ + 0xd8))(pCVar8,(ulong)uVar6 + lVar4);
        }
        pCVar8 = pCVar8 + 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x1000);
      ppCVar5 = ppCVar5 + 1;
      uVar6 = uVar6 + 0x1000;
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
  }
  pvVar3 = this->image_ptr_head_;
  while (pvVar2 = pvVar3, pvVar2 != (vm_image_ptr_page *)0x0) {
    sVar9 = 400;
    if (pvVar2->next_ == (vm_image_ptr_page *)0x0) {
      sVar9 = this->image_ptr_last_cnt_;
    }
    pvVar1 = pvVar2;
    pvVar3 = pvVar2->next_;
    if (sVar9 != 0) {
      do {
        psVar7 = &pvVar1->ptrs_[0].image_data_len_;
        uVar6 = pvVar1->ptrs_[0].obj_id_;
        if ((this->pages_[uVar6 >> 0xc][uVar6 & 0xfff].field_0x14 & 0x80) == 0) {
          (**(code **)(*(long *)&G_obj_table_X.pages_[uVar6 >> 0xc][uVar6 & 0xfff].ptr_ + 0xd0))
                    (G_obj_table_X.pages_[uVar6 >> 0xc] + (uVar6 & 0xfff),uVar6,
                     pvVar1->ptrs_[0].image_data_ptr_,*psVar7);
        }
        sVar9 = sVar9 - 1;
        pvVar1 = (vm_image_ptr_page *)psVar7;
      } while (sVar9 != 0);
      pvVar3 = pvVar2->next_;
    }
  }
  return;
}

Assistant:

void CVmObjTable::reset_to_image(VMG0_)
{
    CVmObjPageEntry **pg;
    CVmObjPageEntry *entry;
    size_t i;
    size_t j;
    vm_obj_id_t id;
    vm_image_ptr_page *ip_page;

    /* 
     *   Drop all undo information.  Since we're resetting to the initial
     *   state, the undo for our outgoing state will no longer be
     *   relevant. 
     */
    G_undo->drop_undo(vmg0_);

    /* delete all of the globals */
    if (globals_ != 0)
    {
        delete globals_;
        globals_ = 0;
    }

    /* 
     *   Go through the object table and reset each non-transient object in
     *   the root set to its initial conditions.  
     */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* scan all objects on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; --j, ++entry, ++id)
        {
            /* 
             *   if it's not free, and it's in the root set, and it's not
             *   transient, reset it 
             */
            if (!entry->free_ && entry->in_root_set_ && !entry->transient_)
            {
                /*
                 *   This object is part of the root set, so it's part of
                 *   the state immediately after loading the image.  Reset
                 *   the object to its load file conditions.  
                 */
                entry->get_vm_obj()->reset_to_image(vmg_ id);
            }
        }
    }

    /*
     *   Go through all of the objects for which we've explicitly saved the
     *   original image file location, and ask them to reset using the image
     *   data. 
     */
    for (ip_page = image_ptr_head_ ; ip_page != 0 ; ip_page = ip_page->next_)
    {
        size_t cnt;
        vm_image_ptr *slot;
        
        /* 
         *   get the count for this page - if this is the last page, it's
         *   the last page counter; otherwise, it's a full page, since we
         *   fill up each page before creating a new one 
         */
        if (ip_page->next_ == 0)
            cnt = image_ptr_last_cnt_;
        else
            cnt = VM_IMAGE_PTRS_PER_PAGE;

        /* go through the records on the page */
        for (slot = ip_page->ptrs_ ; cnt != 0 ; --cnt, ++slot)
        {
            /* it this object is non-transient, reload it */
            if (!get_entry(slot->obj_id_)->transient_)
            {
                /* reload it using the saved image data */
                vm_objp(vmg_ slot->obj_id_)
                    ->reload_from_image(vmg_ slot->obj_id_,
                                        slot->image_data_ptr_,
                                        slot->image_data_len_);
            }
        }
    }
}